

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.hpp
# Opt level: O0

void jsonip::parser::decode_string(string *data)

{
  undefined8 uVar1;
  ulong uVar2;
  char *pcVar3;
  string local_38 [8];
  string buffer;
  size_t pos;
  string *data_local;
  
  buffer.field_2._8_8_ = std::__cxx11::string::find((char)data,0x5c);
  if (buffer.field_2._8_8_ != -1) {
    std::__cxx11::string::string(local_38);
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)local_38);
    if (buffer.field_2._8_8_ != 0) {
      uVar2 = std::__cxx11::string::operator[]((ulong)data);
      std::__cxx11::string::append((char *)local_38,uVar2);
    }
    for (; uVar1 = buffer.field_2._8_8_, uVar2 = std::__cxx11::string::size(), (ulong)uVar1 < uVar2;
        buffer.field_2._8_8_ = buffer.field_2._8_8_ + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
      if (*pcVar3 == '\\') {
        buffer.field_2._8_8_ = buffer.field_2._8_8_ + 1;
        uVar2 = std::__cxx11::string::operator[]((ulong)data);
        std::__cxx11::string::append((char *)local_38,uVar2);
      }
      else {
        uVar2 = std::__cxx11::string::operator[]((ulong)data);
        std::__cxx11::string::append((char *)local_38,uVar2);
      }
    }
    std::__cxx11::string::swap((string *)data);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

inline void decode_string(std::string& data)
    {
        // Fast check for the most common case. No copy.
        size_t pos;
        if (std::string::npos == (pos = data.find('\\'))) return;

        std::string buffer;
        buffer.reserve(data.size());
        // Copy the first part, if it exists
        if (pos) buffer.append(&data[0], pos);
        for (; pos < data.size(); ++pos)  // NOTE: '<' instead of '!='.
        {
            switch (data[pos])
            {
                // NOTE: Do not check for malformed input
                case '\\':
                    buffer.append(&data[++pos], 1);
                    break;
                default:
                    buffer.append(&data[pos], 1);
                    break;
            }
        }
        data.swap(buffer);
    }